

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTinySVD.cpp
# Opt level: O0

void verifyOrthonormal<double>(Matrix33<double> *A)

{
  Matrix33<double> *pMVar1;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  int j;
  int i;
  Matrix33<double> prod;
  double valueEps;
  undefined4 in_stack_ffffffffffffff58;
  int iVar2;
  undefined4 in_stack_ffffffffffffff5c;
  int i_00;
  Matrix33<double> *in_stack_ffffffffffffff70;
  Matrix33<double> *in_stack_ffffffffffffff78;
  Matrix33<double> local_58;
  double local_10;
  
  local_10 = std::numeric_limits<double>::epsilon();
  local_10 = local_10 * 100.0;
  Imath_2_5::Matrix33<double>::transposed
            ((Matrix33<double> *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  Imath_2_5::Matrix33<double>::operator*(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  i_00 = 0;
  do {
    if (2 < i_00) {
      return;
    }
    for (iVar2 = 0; iVar2 < 3; iVar2 = iVar2 + 1) {
      if (i_00 == iVar2) {
        pMVar1 = &local_58;
        Imath_2_5::Matrix33<double>::operator[](pMVar1,i_00);
        std::abs((int)pMVar1);
        if (2.220446049250313e-14 <= extraout_XMM0_Qa) {
          __assert_fail("std::abs (prod[i][j] - 1) < valueEps",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testTinySVD.cpp"
                        ,0x3a,"void verifyOrthonormal(const Imath_2_5::Matrix33<T> &) [T = double]")
          ;
        }
      }
      else {
        pMVar1 = &local_58;
        Imath_2_5::Matrix33<double>::operator[](pMVar1,i_00);
        std::abs((int)pMVar1);
        if (2.220446049250313e-14 <= extraout_XMM0_Qa_00) {
          __assert_fail("std::abs (prod[i][j]) < valueEps",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testTinySVD.cpp"
                        ,0x3c,"void verifyOrthonormal(const Imath_2_5::Matrix33<T> &) [T = double]")
          ;
        }
      }
    }
    i_00 = i_00 + 1;
  } while( true );
}

Assistant:

void
verifyOrthonormal (const IMATH_INTERNAL_NAMESPACE::Matrix33<T>& A)
{
    const T valueEps = T(100) * std::numeric_limits<T>::epsilon();

    const IMATH_INTERNAL_NAMESPACE::Matrix33<T> prod = A * A.transposed();
    for (int i = 0; i < 3; ++i)
    {
        for (int j = 0; j < 3; ++j)
        {
            if (i == j)
                assert (std::abs (prod[i][j] - 1) < valueEps);
            else
                assert (std::abs (prod[i][j]) < valueEps);
        }
    }
}